

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiScene * __thiscall
Assimp::Importer::ReadFileFromMemory
          (Importer *this,void *pBuffer,size_t pLength,uint pFlags,char *pHint)

{
  pointer pIOHandler;
  size_t sVar1;
  IOSystem *pIOHandler_00;
  char *__s;
  char fbuff [228];
  
  __s = "";
  if (pHint != (char *)0x0) {
    __s = pHint;
  }
  if ((pLength != 0 && pBuffer != (void *)0x0) && (sVar1 = strlen(__s), sVar1 < 0xc9)) {
    pIOHandler = (pointer)this->pimpl->mIOHandler;
    this->pimpl->mIOHandler = (IOSystem *)0x0;
    pIOHandler_00 = (IOSystem *)operator_new(0x50);
    (pIOHandler_00->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIOHandler_00->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIOHandler_00->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIOHandler_00->_vptr_IOSystem = (_func_int **)&PTR__MemoryIOSystem_00729ac8;
    pIOHandler_00[1]._vptr_IOSystem = (_func_int **)pBuffer;
    pIOHandler_00[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pLength;
    pIOHandler_00[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIOHandler;
    pIOHandler_00[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIOHandler_00[2]._vptr_IOSystem = (_func_int **)0x0;
    pIOHandler_00[2].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    SetIOHandler(this,pIOHandler_00);
    snprintf(fbuff,0xe4,"%s.%s","$$$___magic___$$$",__s);
    ReadFile(this,fbuff,pFlags);
    SetIOHandler(this,(IOSystem *)pIOHandler);
    return this->pimpl->mScene;
  }
  std::__cxx11::string::assign((char *)&this->pimpl->mErrorString);
  return (aiScene *)0x0;
}

Assistant:

const aiScene* Importer::ReadFileFromMemory( const void* pBuffer,
    size_t pLength,
    unsigned int pFlags,
    const char* pHint /*= ""*/)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    if (!pHint) {
        pHint = "";
    }

    if (!pBuffer || !pLength || strlen(pHint) > MaxLenHint ) {
        pimpl->mErrorString = "Invalid parameters passed to ReadFileFromMemory()";
        return NULL;
    }

    // prevent deletion of the previous IOHandler
    IOSystem* io = pimpl->mIOHandler;
    pimpl->mIOHandler = NULL;

    SetIOHandler(new MemoryIOSystem((const uint8_t*)pBuffer,pLength,io));

    // read the file and recover the previous IOSystem
    static const size_t BufSize(Importer::MaxLenHint + 28);
    char fbuff[BufSize];
    ai_snprintf(fbuff, BufSize, "%s.%s",AI_MEMORYIO_MAGIC_FILENAME,pHint);

    ReadFile(fbuff,pFlags);
    SetIOHandler(io);

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}